

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef lj_record_constify(jit_State *J,cTValue *o)

{
  ulong uVar1;
  uint uVar2;
  TRef TVar3;
  uint uVar4;
  ulong uVar5;
  IRType t;
  
  uVar1 = o->it64;
  uVar5 = (long)uVar1 >> 0x2f;
  uVar2 = (uint)((long)uVar1 >> 0x2f);
  if (uVar2 + 0xd < 9) {
    t = IRT_NUM;
    if (0xfffffffffffffff1 < uVar5) {
      t = ~uVar2;
    }
    TVar3 = lj_ir_kgc(J,(GCobj *)(uVar1 & 0x7fffffffffff),t);
    return TVar3;
  }
  if (uVar5 < 0xfffffffffffffff2) {
    TVar3 = lj_ir_knumint(J,o->n);
    return TVar3;
  }
  uVar4 = 0;
  if (uVar5 + 3 < 2) {
    uVar4 = ~uVar2 * 0x1000001 ^ 0x7fff;
  }
  return uVar4;
}

Assistant:

TRef lj_record_constify(jit_State *J, cTValue *o)
{
  if (tvisgcv(o))
    return lj_ir_kgc(J, gcV(o), itype2irt(o));
  else if (tvisint(o))
    return lj_ir_kint(J, intV(o));
  else if (tvisnum(o))
    return lj_ir_knumint(J, numV(o));
  else if (tvisbool(o))
    return TREF_PRI(itype2irt(o));
  else
    return 0;  /* Can't represent lightuserdata (pointless). */
}